

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool insn_crosses_page(CPUTriCoreState *env,DisasContext_conflict14 *ctx)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint16_t insn;
  DisasContext_conflict14 *ctx_local;
  CPUTriCoreState *env_local;
  
  uVar2 = cpu_lduw_code_tricore(env,(ctx->base).pc_next);
  _Var1 = tricore_insn_is_16bit(uVar2 & 0xffff);
  return (_Bool)((_Var1 ^ 0xffU) & 1);
}

Assistant:

static bool insn_crosses_page(CPUARMState *env, DisasContext *s)
{
    /* Return true if the insn at dc->base.pc_next might cross a page boundary.
     * (False positives are OK, false negatives are not.)
     * We know this is a Thumb insn, and our caller ensures we are
     * only called if dc->base.pc_next is less than 4 bytes from the page
     * boundary, so we cross the page if the first 16 bits indicate
     * that this is a 32 bit insn.
     */
    uint16_t insn = arm_lduw_code(env, s->base.pc_next, s->sctlr_b);

    return !thumb_insn_is_16bit(s, s->base.pc_next, insn);
}